

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O1

void qcc_generate_transform(qcc_generator_ptr self,void *data)

{
  qcc_context *pqVar1;
  uint8_t tmp [128];
  undefined1 auStack_a8 [136];
  
  pqVar1 = self[1].context;
  if (pqVar1->error < (char *)0x81) {
    qcc_stream_begin(*(qcc_stream **)(*(long *)pqVar1 + 0x10));
    (*(code *)pqVar1->stream)(pqVar1,auStack_a8);
    qcc_stream_end(*(qcc_stream **)(*(long *)pqVar1 + 0x10));
    (*(code *)self[1].type_size)
              (self[1].generate,auStack_a8,(self[1].context)->error,data,self->type_size);
    return;
  }
  __assert_fail("transform->src_gen->type_size <= 128",
                "/workspace/llm4binary/github/license_all_cmakelists_25/skhoroshavin[P]qcc/src/generator.c"
                ,0x79,"void qcc_generate_transform(qcc_generator_ptr, void *)");
}

Assistant:

static void qcc_generate_transform(qcc_generator_ptr self, void *data)
{
    struct qcc_generator_transform *transform =
        (struct qcc_generator_transform *)self;

    uint8_t tmp[128];
    assert(transform->src_gen->type_size <= 128);
    qcc_generate(transform->src_gen, tmp);
    transform->transform(transform->params, tmp, transform->src_gen->type_size,
                         data, self->type_size);
}